

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array.h
# Opt level: O0

void __thiscall
array<CGlyphIndex,_allocator_default<CGlyphIndex>_>::clear
          (array<CGlyphIndex,_allocator_default<CGlyphIndex>_> *this)

{
  CGlyphIndex *pCVar1;
  CGlyphIndex *in_RDI;
  
  allocator_default<CGlyphIndex>::free_array(in_RDI);
  *(undefined4 *)&in_RDI->m_pGlyph = 1;
  pCVar1 = allocator_default<CGlyphIndex>::alloc_array(0);
  *(CGlyphIndex **)in_RDI = pCVar1;
  *(undefined4 *)((long)&in_RDI->m_pGlyph + 4) = 0;
  return;
}

Assistant:

void clear()
	{
		ALLOCATOR::free_array(list);
		list_size = 1;
		list = ALLOCATOR::alloc_array(list_size);
		num_elements = 0;
	}